

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrjpgcom.c
# Opt level: O3

uint read_2_bytes(void)

{
  int iVar1;
  int iVar2;
  uint extraout_EAX;
  
  iVar1 = getc((FILE *)infile);
  if (iVar1 == -1) {
    read_2_bytes_cold_2();
  }
  else {
    iVar2 = getc((FILE *)infile);
    if (iVar2 != -1) {
      return iVar2 + iVar1 * 0x100;
    }
  }
  read_2_bytes_cold_1();
  return extraout_EAX;
}

Assistant:

static unsigned int
read_2_bytes(void)
{
  int c1, c2;

  c1 = NEXTBYTE();
  if (c1 == EOF)
    ERREXIT("Premature EOF in JPEG file");
  c2 = NEXTBYTE();
  if (c2 == EOF)
    ERREXIT("Premature EOF in JPEG file");
  return (((unsigned int)c1) << 8) + ((unsigned int)c2);
}